

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O0

RuleScanRecord * __thiscall
anon_unknown.dwarf_1fd0be::BuildEngineImpl::newRuleScanRecord(BuildEngineImpl *this)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  reference ppRVar4;
  ulong uVar5;
  ulong *puVar6;
  RuleScanRecord *pRVar7;
  ulong uVar8;
  RuleScanRecord *local_40;
  value_type result;
  BuildEngineImpl *this_local;
  
  bVar3 = std::
          vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
          ::empty(&this->freeRuleScanRecords);
  if (bVar3) {
    if (this->currentBlockPos == this->currentBlockEnd) {
      uVar1 = this->numScanRecordsPerBlock;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar1;
      uVar5 = SUB168(auVar2 * ZEXT816(0x30),0);
      uVar8 = uVar5 + 8;
      if (SUB168(auVar2 * ZEXT816(0x30),8) != 0 || 0xfffffffffffffff7 < uVar5) {
        uVar8 = 0xffffffffffffffff;
      }
      puVar6 = (ulong *)operator_new__(uVar8);
      *puVar6 = uVar1;
      pRVar7 = (RuleScanRecord *)(puVar6 + 1);
      if (uVar1 != 0) {
        local_40 = pRVar7;
        do {
          RuleScanRecord::RuleScanRecord(local_40);
          local_40 = local_40 + 1;
        } while (local_40 != pRVar7 + uVar1);
      }
      this->currentBlockPos = pRVar7;
      std::
      vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
      ::push_back(&this->ruleScanRecordBlocks,&this->currentBlockPos);
      this->currentBlockEnd = this->currentBlockPos + this->numScanRecordsPerBlock;
    }
    this_local = (BuildEngineImpl *)this->currentBlockPos;
    this->currentBlockPos = (RuleScanRecord *)&(this_local->keyTable).field_0x18;
  }
  else {
    ppRVar4 = std::
              vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
              ::back(&this->freeRuleScanRecords);
    this_local = (BuildEngineImpl *)*ppRVar4;
    std::
    vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
    ::pop_back(&this->freeRuleScanRecords);
  }
  return (RuleScanRecord *)this_local;
}

Assistant:

RuleScanRecord* newRuleScanRecord() {
    // If we have an item on the free list, return it.
    if (!freeRuleScanRecords.empty()) {
      auto result = freeRuleScanRecords.back();
      freeRuleScanRecords.pop_back();
      return result;
    }

    // If we are at the end of a block, allocate a new one.
    if (currentBlockPos == currentBlockEnd) {
      currentBlockPos = new RuleScanRecord[numScanRecordsPerBlock];
      ruleScanRecordBlocks.push_back(currentBlockPos);
      currentBlockEnd = currentBlockPos + numScanRecordsPerBlock;
    }
    return currentBlockPos++;
  }